

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_sad_avx2.c
# Opt level: O2

void sad128x1(uint16_t *src_ptr,uint16_t *ref_ptr,uint16_t *sec_ptr,__m256i *sad_acc)

{
  longlong *plVar1;
  undefined8 *puVar2;
  long lVar3;
  __m256i r [4];
  __m256i s [4];
  __m256i local_160;
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  longlong local_e0;
  longlong lStack_d8;
  longlong lStack_d0;
  longlong lStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  for (lVar3 = 0; (int)lVar3 != 0x100; lVar3 = lVar3 + 0x80) {
    plVar1 = (longlong *)((long)src_ptr + lVar3);
    local_e0 = *plVar1;
    lStack_d8 = plVar1[1];
    lStack_d0 = plVar1[2];
    lStack_c8 = plVar1[3];
    puVar2 = (undefined8 *)((long)src_ptr + lVar3 + 0x20);
    local_c0 = *puVar2;
    uStack_b8 = puVar2[1];
    uStack_b0 = puVar2[2];
    uStack_a8 = puVar2[3];
    puVar2 = (undefined8 *)((long)src_ptr + lVar3 + 0x40);
    local_a0 = *puVar2;
    uStack_98 = puVar2[1];
    uStack_90 = puVar2[2];
    uStack_88 = puVar2[3];
    puVar2 = (undefined8 *)((long)src_ptr + lVar3 + 0x60);
    local_80 = *puVar2;
    uStack_78 = puVar2[1];
    uStack_70 = puVar2[2];
    uStack_68 = puVar2[3];
    local_160 = *(__m256i *)((long)ref_ptr + lVar3);
    local_140 = *(undefined1 (*) [32])((long)ref_ptr + lVar3 + 0x20);
    local_120 = *(undefined1 (*) [32])((long)ref_ptr + lVar3 + 0x40);
    local_100 = *(undefined1 (*) [32])((long)ref_ptr + lVar3 + 0x60);
    if ((undefined1 (*) [32])sec_ptr == (undefined1 (*) [32])0x0) {
      sec_ptr = (uint16_t *)0x0;
    }
    else {
      local_160 = (__m256i)vpavgw_avx2((undefined1  [32])local_160,*(undefined1 (*) [32])sec_ptr);
      local_140 = vpavgw_avx2(local_140,*(undefined1 (*) [32])((long)sec_ptr + 0x20));
      local_120 = vpavgw_avx2(local_120,*(undefined1 (*) [32])((long)sec_ptr + 0x40));
      local_100 = vpavgw_avx2(local_100,*(undefined1 (*) [32])((long)sec_ptr + 0x60));
      sec_ptr = (uint16_t *)((long)sec_ptr + 0x80);
    }
    highbd_sad16x4_core_avx2((__m256i *)&local_e0,&local_160,sad_acc);
  }
  return;
}

Assistant:

static void sad128x1(const uint16_t *src_ptr, const uint16_t *ref_ptr,
                     const uint16_t *sec_ptr, __m256i *sad_acc) {
  __m256i s[4], r[4];
  int i;
  for (i = 0; i < 2; i++) {
    s[0] = _mm256_loadu_si256((const __m256i *)src_ptr);
    s[1] = _mm256_loadu_si256((const __m256i *)(src_ptr + 16));
    s[2] = _mm256_loadu_si256((const __m256i *)(src_ptr + 32));
    s[3] = _mm256_loadu_si256((const __m256i *)(src_ptr + 48));
    r[0] = _mm256_loadu_si256((const __m256i *)ref_ptr);
    r[1] = _mm256_loadu_si256((const __m256i *)(ref_ptr + 16));
    r[2] = _mm256_loadu_si256((const __m256i *)(ref_ptr + 32));
    r[3] = _mm256_loadu_si256((const __m256i *)(ref_ptr + 48));
    if (sec_ptr) {
      r[0] =
          _mm256_avg_epu16(r[0], _mm256_loadu_si256((const __m256i *)sec_ptr));
      r[1] = _mm256_avg_epu16(
          r[1], _mm256_loadu_si256((const __m256i *)(sec_ptr + 16)));
      r[2] = _mm256_avg_epu16(
          r[2], _mm256_loadu_si256((const __m256i *)(sec_ptr + 32)));
      r[3] = _mm256_avg_epu16(
          r[3], _mm256_loadu_si256((const __m256i *)(sec_ptr + 48)));
      sec_ptr += 64;
    }
    highbd_sad16x4_core_avx2(s, r, sad_acc);
    src_ptr += 64;
    ref_ptr += 64;
  }
}